

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

bool __thiscall libcellml::ComponentEntity::removeComponent(ComponentEntity *this,size_t index)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  ComponentImpl *this_00;
  ulong uVar3;
  value_type component;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[2].mId.field_2._M_allocated_capacity;
  uVar3 = (long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) - sVar2) >> 4;
  if (index < uVar3) {
    std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               (sVar2 + index * 0x10));
    pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *)&pEVar1[2].mId.field_2,
            (shared_ptr<libcellml::Component> *)
            (index * 0x10 + pEVar1[2].mId.field_2._M_allocated_capacity));
    this_00 = Component::pFunc(local_30._M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return index < uVar3;
}

Assistant:

bool ComponentEntity::removeComponent(size_t index)
{
    bool status = false;
    if (index < pFunc()->mComponents.size()) {
        auto component = pFunc()->mComponents[index];
        pFunc()->mComponents.erase(pFunc()->mComponents.begin() + ptrdiff_t(index));
        component->pFunc()->removeParent();
        status = true;
    }

    return status;
}